

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_RaiseChildren
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  AActor *thing;
  AActor *pAVar4;
  AActor *pAVar5;
  char *pcVar6;
  AActor *raiser;
  bool bVar7;
  TThinkerIterator<AActor> it;
  FThinkerIterator local_40;
  PClass *pPVar3;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar6 = "(paramnum) < numparam";
    goto LAB_003d9edc;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003d9ecc:
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003d9edc:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1207,
                  "int AF_AActor_A_RaiseChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pAVar5 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar5 == (AActor *)0x0) goto LAB_003d9e18;
    pPVar3 = (pAVar5->super_DThinker).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar2 = (**(pAVar5->super_DThinker).super_DObject._vptr_DObject)(pAVar5);
      pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
      (pAVar5->super_DThinker).super_DObject.Class = pPVar3;
    }
    bVar7 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar1 && bVar7) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar7 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar1) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (!bVar7) {
      pcVar6 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003d9edc;
    }
  }
  else {
    if (pAVar5 != (AActor *)0x0) goto LAB_003d9ecc;
LAB_003d9e18:
    pAVar5 = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type == '\0') {
LAB_003d9e40:
      iVar2 = param[1].field_0.i;
      FThinkerIterator::FThinkerIterator(&local_40,AActor::RegistrationInfo.MyClass,0x80);
      thing = (AActor *)FThinkerIterator::Next(&local_40,false);
      if (thing != (AActor *)0x0) {
        raiser = pAVar5;
        if (iVar2 == 0) {
          raiser = (AActor *)0x0;
        }
        do {
          pAVar4 = (thing->master).field_0.p;
          if (pAVar4 == (AActor *)0x0) {
LAB_003d9e9c:
            pAVar4 = (AActor *)0x0;
          }
          else if (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
            (thing->master).field_0.p = (AActor *)0x0;
            goto LAB_003d9e9c;
          }
          if (pAVar4 == pAVar5) {
            P_Thing_Raise(thing,raiser);
          }
          thing = (AActor *)FThinkerIterator::Next(&local_40,false);
        } while (thing != (AActor *)0x0);
      }
      return 0;
    }
    pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
  }
  else {
    if (param[1].field_0.field_3.Type == '\0') goto LAB_003d9e40;
    pcVar6 = "(param[paramnum]).Type == REGT_INT";
  }
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1208,
                "int AF_AActor_A_RaiseChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_RaiseChildren)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_BOOL_DEF(copy);

	TThinkerIterator<AActor> it;
	AActor *mo;

	while ((mo = it.Next()) != NULL)
	{
		if (mo->master == self)
		{
			P_Thing_Raise(mo, copy ? self : NULL);
		}
	}
	return 0;
}